

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::checker(Solver *this,HyperParam *hyper_param)

{
  bool bVar1;
  allocator local_29;
  string local_28;
  
  bVar1 = Checker::check_param(&this->checker_,hyper_param);
  if (bVar1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_28,"Arguments error",&local_29);
  Color::print_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  exit(0);
}

Assistant:

void Solver::checker(HyperParam& hyper_param) {
  if (!checker_.check_param(hyper_param)) {
    Color::print_error("Arguments error");
    exit(0);
  }
}